

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O2

void R_DrawVoxel(FVector3 *globalpos,FAngle *viewangle,FVector3 *dasprpos,DAngle *dasprang,
                fixed_t daxscale,fixed_t dayscale,FVoxel *voxobj,lighttable_t *colormap,
                short *daumost,short *dadmost,int minslabz,int maxslabz,int flags)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  short sVar8;
  short sVar9;
  uint uVar10;
  int iVar11;
  int stop;
  fixed_t v;
  BYTE *pBVar12;
  short *psVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int vi;
  ulong uVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  int iVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int *piVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  int iVar50;
  long lVar51;
  long lVar52;
  int iVar53;
  int iVar54;
  uint uVar55;
  int iVar56;
  int iVar57;
  byte bVar58;
  uint uVar59;
  long lVar60;
  int iVar61;
  int iVar62;
  int x;
  int iVar63;
  uint uVar64;
  int iVar65;
  byte *pbVar66;
  bool bVar67;
  float fVar68;
  float fVar69;
  double dVar70;
  ulong uStack_4f0;
  int aiStack_4e8 [2];
  int z1a [64];
  int z2a [64];
  int yplc [64];
  long local_198;
  byte local_134;
  int local_b8;
  int local_a8;
  int local_a0;
  int local_98;
  int local_88;
  int local_58;
  int local_48;
  int local_34;
  int iVar28;
  
  uVar59 = daxscale / 0x300;
  uVar55 = dayscale / 0x300;
  if (0x2ff < dayscale && 0x2ff < daxscale) {
    dVar70 = (double)centerxwide;
    dVar14 = dVar70 * 0.00625 * YaspectMul;
    fVar2 = globalpos->X;
    fVar3 = globalpos->Y;
    fVar4 = globalpos->Z;
    fVar5 = dasprpos->X;
    fVar6 = dasprpos->Y;
    fVar7 = dasprpos->Z;
    iVar20 = centerxwide * 0x834;
    uStack_4f0 = 0x33a04a;
    fVar68 = TAngle<float>::Cos(viewangle);
    uStack_4f0 = 0x33a067;
    fVar69 = TAngle<float>::Sin(viewangle);
    uStack_4f0 = 0x33a088;
    dVar15 = TAngle<double>::Cos(dasprang);
    uStack_4f0 = 0x33a0a4;
    dVar16 = TAngle<double>::Sin(dasprang);
    iVar21 = SUB84(103079215104.0 - dVar16,0) >> 2;
    uStack_4f0 = 0x33a0c8;
    R_SetupDrawSlabC(colormap);
    local_88 = SUB84((double)fVar2 + 422212465065984.0,0);
    iVar43 = SUB84((double)fVar5 + 422212465065984.0,0);
    iVar22 = iVar43 - local_88;
    local_48 = SUB84(422212465065984.0 - (double)fVar3,0);
    iVar28 = SUB84(422212465065984.0 - (double)fVar6,0);
    iVar27 = iVar28 - local_48;
    lVar39 = (long)(SUB84((double)fVar68 + 103079215104.0,0) >> 2);
    lVar48 = (long)(SUB84(103079215104.0 - (double)fVar69,0) >> 2);
    uVar33 = (ulong)(iVar27 * lVar48 + iVar22 * lVar39) >> 6;
    iVar29 = (int)uVar33;
    uVar24 = (ulong)(uint)-iVar29;
    if (0 < iVar29) {
      uVar24 = uVar33 & 0xffffffff;
    }
    uVar10 = uVar55;
    if ((int)uVar59 < (int)uVar55) {
      uVar10 = uVar59;
    }
    uVar24 = (uVar24 << 6) / (ulong)uVar10;
    iVar29 = voxobj->NumMips;
    for (iVar35 = 0; (SUB84(FocalLengthX + 824633720832.0,0) <= (int)uVar24 && (iVar35 < iVar29));
        iVar35 = iVar35 + 1) {
      uVar24 = (ulong)(uint)((int)uVar24 >> 1);
    }
    iVar30 = iVar29 + -1;
    if (iVar35 < iVar29) {
      iVar30 = iVar35;
    }
    if (voxobj->Mips[iVar30].SlabData != (BYTE *)0x0) {
      bVar58 = (byte)iVar30;
      uVar10 = minslabz >> (bVar58 & 0x1f);
      iVar29 = maxslabz >> (bVar58 & 0x1f);
      iVar35 = uVar55 << (bVar58 + 8 & 0x1f);
      uStack_4f0 = 0x33a1bc;
      uVar55 = SafeDivScale16(iVar35,SUB84(BaseYaspectMul + 103079215104.0,0));
      local_a8 = SUB84(dVar14 + 103079215104.0,0);
      iVar53 = 0;
      iVar42 = (int)(((long)(int)((double)(int)(uVar59 << (bVar58 + 8 & 0x1f)) / YaspectMul) *
                     (long)local_a8) / (long)(centerxwide << 9));
      iVar56 = (int)(voxobj->Mips[iVar30].Pivot.X * 256.0);
      lVar49 = (long)(int)(0x40000000 / (long)iVar42);
      lVar51 = (long)(int)((ulong)((local_88 - iVar43) * lVar49) >> 0x10);
      lVar60 = (long)(SUB84(dVar15 + 103079215104.0,0) >> 2);
      lVar49 = (long)(int)((ulong)((local_48 - iVar28) * lVar49) >> 0x10);
      iVar41 = (int)(voxobj->Mips[iVar30].Pivot.Y * 256.0);
      iVar63 = (int)((ulong)(lVar49 * iVar21 + lVar51 * lVar60) >> 10) + iVar56 >> 8;
      iVar62 = (int)((ulong)(-iVar21 * lVar51 + lVar49 * lVar60) >> 10) + iVar41 >> 8;
      iVar43 = voxobj->Mips[iVar30].SizeX;
      iVar28 = iVar43 + -1;
      if (iVar63 < iVar43 + -1) {
        iVar28 = iVar63;
      }
      if (iVar63 < 1) {
        iVar28 = 0;
      }
      iVar23 = voxobj->Mips[iVar30].SizeY;
      iVar61 = iVar23 + -1;
      if (iVar62 < iVar23 + -1) {
        iVar61 = iVar62;
      }
      if (iVar62 < 1) {
        iVar61 = 0;
      }
      local_b8 = SUB84(26388279066624.0 - (double)fVar7,0);
      uVar64 = SUB84(26388279066624.0 - (double)fVar4,0) - local_b8;
      uVar59 = -uVar64;
      if (0 < (int)uVar64) {
        uVar59 = uVar64;
      }
      uVar32 = -uVar55;
      if (0 < (int)uVar55) {
        uVar32 = uVar55;
      }
      if (uVar59 >> 10 < uVar32) {
        uVar24 = (ulong)((long)iVar21 * (long)iVar42) >> 0xe;
        lVar51 = (long)(int)((ulong)(lVar60 * iVar42) >> 0xe);
        lVar49 = (long)(int)(0x40000000 /
                            (long)(int)(((long)(int)((ulong)((long)viewingrangerecip *
                                                            (long)local_a8) >> 0x10) * (long)iVar35)
                                       / (long)(centerxwide << 9)));
        uVar33 = lVar48 * lVar49;
        iVar35 = (int)((ulong)(lVar39 * lVar49) >> 0x10);
        iVar22 = iVar22 - (int)((ulong)(((long)(uVar24 * -0x100000000) >> 0x20) * (long)iVar41 +
                                       lVar51 * iVar56) >> 0x12);
        lVar39 = (long)(int)uVar24;
        iVar27 = iVar27 - (int)((ulong)(iVar56 * lVar39 + iVar41 * lVar51) >> 0x12);
        iVar42 = (int)(uVar33 >> 0x10);
        dVar14 = voxobj->Mips[iVar30].Pivot.Z;
        iVar21 = (int)((ulong)(((long)((uVar33 >> 0x10) * -0x100000000) >> 0x20) * lVar51 +
                              iVar35 * lVar39) >> 10);
        iVar41 = (int)((ulong)(iVar42 * lVar39 + iVar35 * lVar51) >> 10);
        if (iVar23 < iVar43) {
          iVar23 = iVar43;
        }
        lVar39 = -((long)(iVar23 + 1) * 8 + 0xfU & 0xfffffffffffffff0);
        piVar46 = (int *)((long)aiStack_4e8 + lVar39);
        piVar1 = piVar46 + (iVar23 + 1);
        iVar43 = 0;
        for (lVar48 = 0; lVar48 <= iVar23; lVar48 = lVar48 + 1) {
          piVar46[lVar48] = iVar43;
          iVar43 = iVar43 + iVar21;
          piVar1[lVar48] = iVar53;
          iVar53 = iVar53 + iVar41;
        }
        iVar53 = -iVar21;
        iVar43 = iVar21;
        if (iVar21 < 1) {
          iVar43 = iVar53;
        }
        iVar56 = -iVar41;
        if (0 < iVar41) {
          iVar56 = iVar41;
        }
        uVar59 = (uint)(iVar56 + iVar43) >> 1;
        *(undefined8 *)((long)aiStack_4e8 + lVar39 + -8) = 1;
        local_58 = 0;
        local_a0 = 0;
        local_34 = 0;
        local_98 = 0;
        iVar43 = (int)*(undefined8 *)((long)aiStack_4e8 + lVar39 + -8);
        if (((0 < iVar28) && ((-1 < iVar43 || (iVar61 < 0)))) && ((iVar43 < 1 || (0 < iVar61)))) {
          *(undefined8 *)((long)aiStack_4e8 + lVar39 + -8) = 0xffffffffffffffff;
          uVar32 = (uint)*(undefined8 *)((long)aiStack_4e8 + lVar39 + -8);
          if (iVar62 < 1) {
            uVar32 = (uint)(iVar62 != 0);
          }
          *(undefined8 *)((long)aiStack_4e8 + lVar39 + -8) = 0xfffffffffffffffd;
          iVar56 = (int)*(undefined8 *)((long)aiStack_4e8 + lVar39 + -8);
          if (iVar63 < 1) {
            iVar56 = (uint)(iVar63 != 0) * 3;
          }
          switch(uVar32 + iVar56) {
          case 1:
          case 4:
            local_58 = iVar21;
            local_a0 = iVar41;
            break;
          case 2:
          case 3:
            local_a0 = 0;
            local_58 = 0;
            break;
          case 0xfffffffc:
          case 0xffffffff:
            local_58 = iVar41;
            local_a0 = iVar53;
            break;
          case 0xfffffffd:
          case 0xfffffffe:
            local_58 = iVar21 + iVar41;
            local_a0 = iVar41 - iVar21;
          }
          switch(uVar32 + iVar56) {
          case 3:
          case 4:
            local_34 = iVar41;
            local_98 = iVar53;
            break;
          case 0xfffffffc:
          case 0xfffffffd:
            local_34 = iVar21;
            local_98 = iVar41;
            break;
          case 0xfffffffe:
          case 1:
            local_98 = 0;
            local_34 = 0;
            break;
          case 0xffffffff:
          case 2:
            local_34 = iVar21 + iVar41;
            local_98 = iVar41 - iVar21;
          }
          bVar58 = (0 < iVar62) << 2 | '\x01' << (0 < iVar63);
          local_134 = bVar58 + 4;
          lVar48 = (long)viewingrangerecip;
          iVar56 = (int)((ulong)(iVar41 * lVar48) >> 0x10);
          iVar41 = -iVar56;
          if (0 < iVar43) {
            iVar21 = iVar53;
            iVar41 = iVar56;
          }
          local_34 = local_34 - local_58;
          lVar51 = (long)local_58;
          iVar53 = *piVar1;
          local_198 = 0;
          iVar56 = *piVar46;
          for (lVar49 = 0; lVar49 != iVar28; lVar49 = lVar49 + iVar43) {
            iVar62 = voxobj->Mips[iVar30].OffsetX[lVar49];
            pBVar12 = voxobj->Mips[iVar30].SlabData;
            lVar25 = ((long)voxobj->Mips[iVar30].SizeY + 1) * lVar49;
            psVar13 = voxobj->Mips[iVar30].OffsetXY;
            local_58 = (int)((ulong)(lVar51 * lVar48) >> 0x10);
            local_58 = (int)((ulong)((long)viewingrangerecip *
                                    ((long)piVar46[lVar49] +
                                    (long)(iVar27 * iVar35 - iVar22 * iVar42) + (long)iVar53)) >>
                            0x10) + local_58;
            iVar63 = piVar1[lVar49] + ((iVar27 * iVar42 + iVar22 * iVar35) - iVar56);
            for (lVar60 = local_198; lVar60 != iVar61; lVar60 = lVar60 + iVar43) {
              if (iVar63 < 0x3ff00000 && iVar20 < iVar63) {
                sVar8 = psVar13[lVar25 + lVar60];
                sVar9 = psVar13[lVar25 + lVar60 + 1];
                if (sVar8 < sVar9) {
                  iVar23 = SUB84(((double)local_58 * dVar70) / (double)(local_a0 + iVar63) +
                                 6755399441055744.0,0) + centerx;
                  if (iVar23 < 1) {
                    iVar23 = 0;
                  }
                  iVar31 = SUB84(((double)((int)((ulong)(local_34 * lVar48) >> 0x10) + local_58) *
                                 dVar70) / (double)(local_98 + iVar63) + 6755399441055744.0,0) +
                           centerx;
                  if (viewwidth <= iVar31) {
                    iVar31 = viewwidth;
                  }
                  if (iVar23 < iVar31) {
                    pbVar66 = pBVar12 + (long)sVar8 + (long)iVar62;
                    iVar17 = viewwidth - iVar31;
                    iVar18 = viewwidth - iVar23;
                    if ((flags & 4U) == 0) {
                      iVar17 = iVar23;
                      iVar18 = iVar31;
                    }
                    lVar34 = (long)SUB84((dVar70 * 34359738368.0) / (double)(int)(iVar63 + uVar59) +
                                         6755399441055744.0,0);
                    lVar26 = (long)SUB84((dVar70 * 34359738368.0) / (double)(int)(iVar63 - uVar59) +
                                         6755399441055744.0,0);
                    iVar23 = iVar18 - iVar17;
                    *(undefined8 *)((long)aiStack_4e8 + lVar39 + -8) = 0x40;
                    if (0x3f < iVar23) {
                      iVar23 = (int)*(undefined8 *)((long)aiStack_4e8 + lVar39 + -8);
                    }
                    for (; pbVar66 < pBVar12 + (long)sVar9 + (long)iVar62;
                        pbVar66 = pbVar66 + uVar24 + 3) {
                      uVar32 = (uint)*pbVar66;
                      iVar31 = uVar10 - uVar32;
                      bVar67 = iVar31 == 0;
                      if (bVar67 || (int)uVar10 < (int)uVar32) {
                        iVar31 = 0;
                      }
                      uVar24 = (ulong)pbVar66[1];
                      uVar37 = (uint)*pbVar66;
                      if (!bVar67 && (int)uVar32 <= (int)uVar10) {
                        uVar37 = uVar10;
                      }
                      iVar36 = (uint)pbVar66[1] - iVar31;
                      iVar44 = iVar36 + uVar37;
                      iVar50 = iVar29 - iVar44;
                      if (iVar44 <= iVar29) {
                        iVar50 = 0;
                      }
                      iVar50 = iVar50 + iVar36;
                      if (0 < iVar50) {
                        uVar32 = uVar37 * 0x8000 -
                                 ((int)(dVar14 * 256.0) * 0x80 +
                                 (int)(((long)(int)uVar64 << 0x15) /
                                      ((long)(int)uVar55 * 0xe8000000 >> 0x20)));
                        if ((int)uVar32 < 0) {
                          uVar37 = iVar50 * 0x8000 + uVar32;
                          if ((int)uVar37 < 0) {
                            if ((bVar58 + 0x24 & pbVar66[2]) != 0) {
                              iVar36 = (int)((ulong)((int)uVar37 * lVar34) >> 0x20);
                              goto LAB_0033ab69;
                            }
                          }
                          else if ((local_134 & pbVar66[2]) != 0) {
                            iVar36 = (int)((ulong)uVar37 * lVar26 >> 0x20);
LAB_0033ab69:
                            iVar44 = (int)((ulong)((int)uVar32 * lVar26) >> 0x20);
                            goto LAB_0033ab87;
                          }
                        }
                        else if ((pbVar66[2] & bVar58 + 0x14) != 0) {
                          iVar44 = (int)((ulong)uVar32 * lVar34 >> 0x20);
                          iVar36 = (int)((ulong)((int)(iVar50 * 0x8000 + uVar32) * lVar26) >> 0x20);
LAB_0033ab87:
                          iVar44 = iVar44 + centery;
                          iVar36 = iVar36 + centery;
                          iVar45 = iVar36 - iVar44;
                          if (iVar45 != 0 && iVar44 <= iVar36) {
                            vi = 0;
                            if (iVar50 != 1) {
                              if (iVar45 < 0x400) {
                                vi = (int)(0xffffff / (long)iVar45) * iVar50 >> 8;
                              }
                              else {
                                *(undefined8 *)((long)aiStack_4e8 + lVar39 + -8) = 0x33abb0;
                                vi = SafeDivScale16(iVar50,iVar45);
                              }
                            }
                            iVar57 = iVar17;
                            iVar45 = iVar23;
                            while (iVar57 < iVar18) {
                              for (lVar40 = 0; lVar40 < iVar45; lVar40 = lVar40 + 1) {
                                if (iVar50 == 1) {
                                  z2a[lVar40 + 0x3e] = 0;
                                  iVar47 = (int)daumost[iVar57 + lVar40];
                                  if (daumost[iVar57 + lVar40] < iVar44) {
                                    iVar47 = iVar44;
                                  }
                                }
                                else {
                                  iVar47 = (int)daumost[iVar57 + lVar40];
                                  if (iVar47 - iVar44 == 0 || iVar47 < iVar44) {
                                    z2a[lVar40 + 0x3e] = 0;
                                    iVar47 = iVar44;
                                  }
                                  else {
                                    z2a[lVar40 + 0x3e] = (iVar47 - iVar44) * vi;
                                  }
                                }
                                aiStack_4e8[lVar40] = iVar47;
                                iVar47 = (int)dadmost[iVar57 + lVar40];
                                if (iVar36 < dadmost[iVar57 + lVar40]) {
                                  iVar47 = iVar36;
                                }
                                z1a[lVar40 + 0x3e] = iVar47;
                              }
                              iVar47 = 0;
                              while (iVar65 = iVar47, iVar65 < iVar45) {
                                lVar40 = (long)iVar65;
                                iVar11 = aiStack_4e8[lVar40];
                                stop = z1a[lVar40 + 0x3e];
                                iVar38 = stop - iVar11;
                                if (iVar38 == 0 || stop < iVar11) {
                                  iVar47 = iVar65 + 1;
                                }
                                else {
                                  *(undefined8 *)((long)aiStack_4e8 + lVar39 + -8) = 1;
                                  lVar19 = *(long *)((long)aiStack_4e8 + lVar39 + -8);
                                  iVar47 = iVar65;
                                  do {
                                    iVar54 = iVar47;
                                    lVar52 = lVar19;
                                    if (((long)iVar45 <= lVar40 + lVar52) ||
                                       (aiStack_4e8[lVar40 + lVar52] != iVar11)) break;
                                    lVar19 = lVar52 + 1;
                                    iVar47 = iVar54 + 1;
                                  } while (z1a[lVar40 + lVar52 + 0x3e] == stop);
                                  iVar47 = iVar54 + 1;
                                  if ((flags & 1U) == 0) {
                                    iVar11 = ylookup[iVar11];
                                    v = z2a[lVar40 + 0x3e];
                                    *(undefined8 *)((long)aiStack_4e8 + lVar39 + -8) = 0x33ad63;
                                    R_DrawSlabC((int)lVar52,v,iVar38,vi,pbVar66 + (long)iVar31 + 3,
                                                dc_destorg + (iVar65 + iVar57 + iVar11));
                                  }
                                  else {
                                    dc_yh = stop + -1;
                                    dc_yl = iVar11;
                                    dc_iscale = vi;
                                    dc_count = iVar38;
                                    for (; iVar65 <= iVar54; iVar65 = iVar65 + 1) {
                                      iVar38 = iVar57 + iVar65;
                                      *(undefined8 *)((long)aiStack_4e8 + lVar39 + -8) = 0x33adc7;
                                      FCoverageBuffer::InsertSpan
                                                (OffscreenCoverageBuffer,iVar38,iVar11,stop);
                                      if ((flags & 2U) == 0) {
                                        *(undefined8 *)((long)aiStack_4e8 + lVar39 + -8) = 0x33adf5;
                                        dc_x = iVar38;
                                        rt_initcols(OffscreenColorBuffer +
                                                    (long)OffscreenBufferHeight *
                                                    ((long)iVar38 & 0xfffffffffffffffcU));
                                        dc_texturefrac = z2a[lVar40 + 0x3e];
                                        *(undefined8 *)((long)aiStack_4e8 + lVar39 + -8) = 0x33ae23;
                                        dc_source = pbVar66 + (long)iVar31 + 3;
                                        (*hcolfunc_pre)();
                                      }
                                    }
                                  }
                                }
                              }
                              iVar57 = iVar57 + 0x40;
                              iVar45 = iVar18 - iVar57;
                              *(undefined8 *)((long)aiStack_4e8 + lVar39 + -8) = 0x40;
                              if (0x3f < iVar45) {
                                iVar45 = (int)*(undefined8 *)((long)aiStack_4e8 + lVar39 + -8);
                              }
                            }
                            uVar24 = (ulong)pbVar66[1];
                          }
                        }
                      }
                    }
                  }
                }
              }
              local_58 = local_58 + iVar41;
              iVar63 = iVar63 + iVar21;
            }
          }
        }
        *(undefined8 *)((long)aiStack_4e8 + lVar39 + -8) = 1;
        (*(code *)&UNK_0033a57e)
                  (1,&UNK_0033a57e,0,*(ulong *)((long)aiStack_4e8 + lVar39 + -8) & 0xffffffff);
        return;
      }
    }
  }
  return;
}

Assistant:

void R_DrawVoxel(const FVector3 &globalpos, FAngle viewangle,
	const FVector3 &dasprpos, DAngle dasprang,
	fixed_t daxscale, fixed_t dayscale, FVoxel *voxobj,
	lighttable_t *colormap, short *daumost, short *dadmost, int minslabz, int maxslabz, int flags)
{
	int i, j, k, x, y, syoff, ggxstart, ggystart, nxoff;
	fixed_t cosang, sinang, sprcosang, sprsinang;
	int backx, backy, gxinc, gyinc;
	int daxscalerecip, dayscalerecip, cnt, gxstart, gystart, dazscale;
	int lx, rx, nx, ny, x1=0, y1=0, x2=0, y2=0, yinc=0;
	int yoff, xs=0, ys=0, xe, ye, xi=0, yi=0, cbackx, cbacky, dagxinc, dagyinc;
	kvxslab_t *voxptr, *voxend;
	FVoxelMipLevel *mip;
	int z1a[64], z2a[64], yplc[64];

	const int nytooclose = centerxwide * 2100, nytoofar = 32768*32768 - 1048576;
	const int xdimenscale = FLOAT2FIXED(centerxwide * YaspectMul / 160);
	const double centerxwide_f = centerxwide;
	const double centerxwidebig_f = centerxwide_f * 65536*65536*8;

	// Convert to Build's coordinate system.
	fixed_t globalposx = xs_Fix<4>::ToFix(globalpos.X);
	fixed_t globalposy = xs_Fix<4>::ToFix(-globalpos.Y);
	fixed_t globalposz = xs_Fix<8>::ToFix(-globalpos.Z);

	fixed_t dasprx = xs_Fix<4>::ToFix(dasprpos.X);
	fixed_t daspry = xs_Fix<4>::ToFix(-dasprpos.Y);
	fixed_t dasprz = xs_Fix<8>::ToFix(-dasprpos.Z);

	// Shift the scales from 16 bits of fractional precision to 6.
	// Also do some magic voodoo scaling to make them the right size.
	daxscale = daxscale / (0xC000 >> 6);
	dayscale = dayscale / (0xC000 >> 6);
	if (daxscale <= 0 || dayscale <= 0)
	{
		// won't be visible.
		return;
	}

	angle_t viewang = viewangle.BAMs();
	cosang = FLOAT2FIXED(viewangle.Cos()) >> 2;
	sinang = FLOAT2FIXED(-viewangle.Sin()) >> 2;
	sprcosang = FLOAT2FIXED(dasprang.Cos()) >> 2;
	sprsinang = FLOAT2FIXED(-dasprang.Sin()) >> 2;

	R_SetupDrawSlab(colormap);

	// Select mip level
	i = abs(DMulScale6(dasprx - globalposx, cosang, daspry - globalposy, sinang));
	i = DivScale6(i, MIN(daxscale, dayscale));
	j = xs_Fix<13>::ToFix(FocalLengthX);
	for (k = 0; i >= j && k < voxobj->NumMips; ++k)
	{
		i >>= 1;
	}
	if (k >= voxobj->NumMips) k = voxobj->NumMips - 1;

	mip = &voxobj->Mips[k];		if (mip->SlabData == NULL) return;

	minslabz >>= k;
	maxslabz >>= k;

	daxscale <<= (k+8); dayscale <<= (k+8);
	dazscale = FixedDiv(dayscale, FLOAT2FIXED(BaseYaspectMul));
	daxscale = fixed_t(daxscale / YaspectMul);
	daxscale = Scale(daxscale, xdimenscale, centerxwide << 9);
	dayscale = Scale(dayscale, FixedMul(xdimenscale, viewingrangerecip), centerxwide << 9);

	daxscalerecip = (1<<30) / daxscale;
	dayscalerecip = (1<<30) / dayscale;

	fixed_t piv_x = fixed_t(mip->Pivot.X*256.);
	fixed_t piv_y = fixed_t(mip->Pivot.Y*256.);
	fixed_t piv_z = fixed_t(mip->Pivot.Z*256.);

	x = FixedMul(globalposx - dasprx, daxscalerecip);
	y = FixedMul(globalposy - daspry, daxscalerecip);
	backx = (DMulScale10(x, sprcosang, y,  sprsinang) + piv_x) >> 8;
	backy = (DMulScale10(y, sprcosang, x, -sprsinang) + piv_y) >> 8;
	cbackx = clamp(backx, 0, mip->SizeX - 1);
	cbacky = clamp(backy, 0, mip->SizeY - 1);

	sprcosang = MulScale14(daxscale, sprcosang);
	sprsinang = MulScale14(daxscale, sprsinang);

	x = (dasprx - globalposx) - DMulScale18(piv_x, sprcosang, piv_y, -sprsinang);
	y = (daspry - globalposy) - DMulScale18(piv_y, sprcosang, piv_x,  sprsinang);

	cosang = FixedMul(cosang, dayscalerecip);
	sinang = FixedMul(sinang, dayscalerecip);

	gxstart = y*cosang - x*sinang;
	gystart = x*cosang + y*sinang;
	gxinc = DMulScale10(sprsinang, cosang, sprcosang, -sinang);
	gyinc = DMulScale10(sprcosang, cosang, sprsinang,  sinang);
	if ((abs(globalposz - dasprz) >> 10) >= abs(dazscale)) return;

	x = 0; y = 0; j = MAX(mip->SizeX, mip->SizeY);
	fixed_t *ggxinc = (fixed_t *)alloca((j + 1) * sizeof(fixed_t) * 2);
	fixed_t *ggyinc = ggxinc + (j + 1);
	for (i = 0; i <= j; i++)
	{
		ggxinc[i] = x; x += gxinc;
		ggyinc[i] = y; y += gyinc;
	}

	syoff = DivScale21(globalposz - dasprz, FixedMul(dazscale, 0xE800)) + (piv_z << 7);
	yoff = (abs(gxinc) + abs(gyinc)) >> 1;

	for (cnt = 0; cnt < 8; cnt++)
	{
		switch (cnt)
		{
			case 0: xs = 0;				ys = 0;				xi =  1; yi =  1; break;
			case 1: xs = mip->SizeX-1;	ys = 0;				xi = -1; yi =  1; break;
			case 2: xs = 0;				ys = mip->SizeY-1;	xi =  1; yi = -1; break;
			case 3: xs = mip->SizeX-1;	ys = mip->SizeY-1;	xi = -1; yi = -1; break;
			case 4: xs = 0;				ys = cbacky;		xi =  1; yi =  2; break;
			case 5: xs = mip->SizeX-1;	ys = cbacky;		xi = -1; yi =  2; break;
			case 6: xs = cbackx;		ys = 0;				xi =  2; yi =  1; break;
			case 7: xs = cbackx;		ys = mip->SizeY-1;	xi =  2; yi = -1; break;
		}
		xe = cbackx; ye = cbacky;
		if (cnt < 4)
		{
			if ((xi < 0) && (xe >= xs)) continue;
			if ((xi > 0) && (xe <= xs)) continue;
			if ((yi < 0) && (ye >= ys)) continue;
			if ((yi > 0) && (ye <= ys)) continue;
		}
		else
		{
			if ((xi < 0) && (xe > xs)) continue;
			if ((xi > 0) && (xe < xs)) continue;
			if ((yi < 0) && (ye > ys)) continue;
			if ((yi > 0) && (ye < ys)) continue;
			xe += xi; ye += yi;
		}

		i = ksgn(ys-backy)+ksgn(xs-backx)*3+4;
		switch(i)
		{
			case 6: case 7: x1 = 0;				y1 = 0;				break;
			case 8: case 5: x1 = gxinc;			y1 = gyinc;			break;
			case 0: case 3: x1 = gyinc;			y1 = -gxinc;		break;
			case 2: case 1: x1 = gxinc+gyinc;	y1 = gyinc-gxinc;	break;
		}
		switch(i)
		{
			case 2: case 5: x2 = 0;				y2 = 0;				break;
			case 0: case 1: x2 = gxinc;			y2 = gyinc;			break;
			case 8: case 7: x2 = gyinc;			y2 = -gxinc;		break;
			case 6: case 3: x2 = gxinc+gyinc;	y2 = gyinc-gxinc;	break;
		}
		BYTE oand = (1 << int(xs<backx)) + (1 << (int(ys<backy)+2));
		BYTE oand16 = oand + 16;
		BYTE oand32 = oand + 32;

		if (yi > 0) { dagxinc =  gxinc; dagyinc =  FixedMul(gyinc, viewingrangerecip); }
			   else { dagxinc = -gxinc; dagyinc = -FixedMul(gyinc, viewingrangerecip); }

			/* Fix for non 90 degree viewing ranges */
		nxoff = FixedMul(x2 - x1, viewingrangerecip);
		x1 = FixedMul(x1, viewingrangerecip);

		ggxstart = gxstart + ggyinc[ys];
		ggystart = gystart - ggxinc[ys];

		for (x = xs; x != xe; x += xi)
		{
			BYTE *slabxoffs = &mip->SlabData[mip->OffsetX[x]];
			short *xyoffs = &mip->OffsetXY[x * (mip->SizeY + 1)];

			nx = FixedMul(ggxstart + ggxinc[x], viewingrangerecip) + x1;
			ny = ggystart + ggyinc[x];
			for (y = ys; y != ye; y += yi, nx += dagyinc, ny -= dagxinc)
			{
				if ((ny <= nytooclose) || (ny >= nytoofar)) continue;
				voxptr = (kvxslab_t *)(slabxoffs + xyoffs[y]);
				voxend = (kvxslab_t *)(slabxoffs + xyoffs[y+1]);
				if (voxptr >= voxend) continue;

				lx = xs_RoundToInt(nx * centerxwide_f / (ny + y1)) + centerx;
				if (lx < 0) lx = 0;
				rx = xs_RoundToInt((nx + nxoff) * centerxwide_f / (ny + y2)) + centerx;
				if (rx > viewwidth) rx = viewwidth;
				if (rx <= lx) continue;

				if (flags & DVF_MIRRORED)
				{
					int t = viewwidth - lx;
					lx = viewwidth - rx;
					rx = t;
				}

				fixed_t l1 = xs_RoundToInt(centerxwidebig_f / (ny - yoff));
				fixed_t l2 = xs_RoundToInt(centerxwidebig_f / (ny + yoff));
				for (; voxptr < voxend; voxptr = (kvxslab_t *)((BYTE *)voxptr + voxptr->zleng + 3))
				{
					const BYTE *col = voxptr->col;
					int zleng = voxptr->zleng;
					int ztop = voxptr->ztop;
					fixed_t z1, z2;

					if (ztop < minslabz)
					{
						int diff = minslabz - ztop;
						ztop = minslabz;
						col += diff;
						zleng -= diff;
					}
					if (ztop + zleng > maxslabz)
					{
						int diff = ztop + zleng - maxslabz;
						zleng -= diff;
					}
					if (zleng <= 0) continue;

					j = (ztop << 15) - syoff;
					if (j < 0)
					{
						k = j + (zleng << 15);
						if (k < 0)
						{
							if ((voxptr->backfacecull & oand32) == 0) continue;
							z2 = MulScale32(l2, k) + centery;					/* Below slab */
						}
						else
						{
							if ((voxptr->backfacecull & oand) == 0) continue;	/* Middle of slab */
							z2 = MulScale32(l1, k) + centery;
						}
						z1 = MulScale32(l1, j) + centery;
					}
					else
					{
						if ((voxptr->backfacecull & oand16) == 0) continue;
						z1 = MulScale32(l2, j) + centery;						/* Above slab */
						z2 = MulScale32(l1, j + (zleng << 15)) + centery;
					}

					if (z2 <= z1) continue;

					if (zleng == 1)
					{
						yinc = 0;
					}
					else
					{
						if (z2-z1 >= 1024) yinc = FixedDiv(zleng, z2 - z1);
						else yinc = (((1 << 24) - 1) / (z2 - z1)) * zleng >> 8;
					}
					// [RH] Clip each column separately, not just by the first one.
					for (int stripwidth = MIN<int>(countof(z1a), rx - lx), lxt = lx;
						lxt < rx;
						(lxt += countof(z1a)), stripwidth = MIN<int>(countof(z1a), rx - lxt))
					{
						// Calculate top and bottom pixels locations
						for (int xxx = 0; xxx < stripwidth; ++xxx)
						{
							if (zleng == 1)
							{
								yplc[xxx] = 0;
								z1a[xxx] = MAX<int>(z1, daumost[lxt + xxx]);
							}
							else
							{
								if (z1 < daumost[lxt + xxx])
								{
									yplc[xxx] = yinc * (daumost[lxt + xxx] - z1);
									z1a[xxx] = daumost[lxt + xxx];
								}
								else
								{
									yplc[xxx] = 0;
									z1a[xxx] = z1;
								}
							}
							z2a[xxx] = MIN<int>(z2, dadmost[lxt + xxx]);
						}
						// Find top and bottom pixels that match and draw them as one strip
						for (int xxl = 0, xxr; xxl < stripwidth; )
						{
							if (z1a[xxl] >= z2a[xxl])
							{ // No column here
								xxl++;
								continue;
							}
							int z1 = z1a[xxl];
							int z2 = z2a[xxl];
							// How many columns share the same extents?
							for (xxr = xxl + 1; xxr < stripwidth; ++xxr)
							{
								if (z1a[xxr] != z1 || z2a[xxr] != z2)
									break;
							}

							if (!(flags & DVF_OFFSCREEN))
							{
								// Draw directly to the screen.
								R_DrawSlab(xxr - xxl, yplc[xxl], z2 - z1, yinc, col, ylookup[z1] + lxt + xxl + dc_destorg);
							}
							else
							{
								// Record the area covered and possibly draw to an offscreen buffer.
								dc_yl = z1;
								dc_yh = z2 - 1;
								dc_count = z2 - z1;
								dc_iscale = yinc;
								for (int x = xxl; x < xxr; ++x)
								{
									OffscreenCoverageBuffer->InsertSpan(lxt + x, z1, z2);
									if (!(flags & DVF_SPANSONLY))
									{
										dc_x = lxt + x;
										rt_initcols(OffscreenColorBuffer + (dc_x & ~3) * OffscreenBufferHeight);
										dc_source = col;
										dc_texturefrac = yplc[xxl];
										hcolfunc_pre();
									}
								}
							}
							xxl = xxr;
						}
					}
				}
			}
		}
	}
}